

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed-animatable.cc
# Opt level: O3

bool tinyusdz::tydra::EvaluateTypedAnimatableAttribute<tinyusdz::value::color4f>
               (Stage *stage,TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_> *tattr,
               string *attr_name,color4f *value_out,string *err,double t,
               TimeSampleInterpolationType tinterp)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  color4f *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  ostringstream ss_e;
  TerminalAttributeValue value;
  string local_5a8;
  long *local_588 [2];
  long local_578 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  undefined1 local_528 [32];
  Variability VStack_508;
  uint uStack_504;
  undefined1 uStack_500;
  undefined7 uStack_4ff;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_> TStack_4f8;
  undefined7 uStack_4f7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  storage_union local_4e0;
  vtable_type *local_4d0;
  bool local_4c8;
  undefined1 local_4c0 [8];
  ios_base iStack_4b8;
  undefined7 uStack_4b7;
  undefined1 uStack_4b0;
  undefined8 uStack_4af;
  undefined1 local_4a0 [24];
  AttrMetas AStack_488;
  undefined1 local_280 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  Variability local_258;
  storage_union local_250;
  vtable_type *local_240;
  AttrMetas local_238;
  
  if (value_out == (color4f *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed-animatable.cc"
               ,0x6f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_528,"EvaluateTypedAnimatableAttribute",0x20);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_528,0xd4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_528,"`value_out` param is nullptr.",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_528,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_280._0_8_);
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
    ::std::ios_base::~ios_base(&iStack_4b8);
    return false;
  }
  if (tattr[0x268] != (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>)0x1) {
    args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)tinterp;
    if (tattr[0x228] == (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>)0x1) {
      uStack_500 = 0;
      uStack_4ff = 0;
      TStack_4f8 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>)0x0;
      local_528._24_8_ = (pointer)0x0;
      VStack_508 = Varying;
      uStack_504 = 0;
      local_528._0_8_ = *(undefined8 *)(tattr + 0x230);
      local_528._8_8_ = *(undefined8 *)(tattr + 0x238);
      local_528[0x10] = (undefined1)*(undefined2 *)(tattr + 0x240);
      local_528[0x11] = (undefined1)((ushort)*(undefined2 *)(tattr + 0x240) >> 8);
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out;
      ::std::
      vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample>_>
      ::operator=((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample>_>
                   *)(local_528 + 0x18),
                  (vector<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color4f>::Sample>_>
                   *)(tattr + 0x248));
      TStack_4f8 = tattr[0x260];
      bVar4 = Animatable<tinyusdz::value::color4f>::get
                        ((Animatable<tinyusdz::value::color4f> *)local_528,t,value_out,tinterp);
      if (err != (string *)0x0 && !bVar4) {
        local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_5a8,"Failed to get TypedAnimatableAttribute value: {} \n","");
        fmt::format<std::__cxx11::string>
                  ((string *)local_280,(fmt *)&local_5a8,(string *)attr_name,args);
        ::std::__cxx11::string::_M_append((char *)err,local_280._0_8_);
        if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
          operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((pointer)local_528._24_8_ != (pointer)0x0) {
        operator_delete((void *)local_528._24_8_,CONCAT71(uStack_4ff,uStack_500) - local_528._24_8_)
        ;
        return bVar4;
      }
      return bVar4;
    }
    if (*(long *)(tattr + 0x218) != *(long *)(tattr + 0x210)) {
      local_528._0_8_ = local_528 + 0x10;
      bVar4 = false;
      local_528._8_8_ = 0;
      local_528[0x10] = false;
      VStack_508 = Varying;
      uStack_504 = uStack_504 & 0xffffff00;
      uStack_500 = SUB81(&local_4f0,0);
      uStack_4ff = (undefined7)((ulong)&local_4f0 >> 8);
      TStack_4f8 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>)0x0;
      uStack_4f7 = 0;
      local_4f0._M_local_buf[0] = '\0';
      local_4d0 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_4e0.dynamic = (void *)0x0;
      local_4c8 = false;
      local_4c0 = (undefined1  [8])0x0;
      iStack_4b8 = (ios_base)0x0;
      uStack_4b7 = 0;
      uStack_4b0 = 0;
      uStack_4af = 0;
      AStack_488.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
      AStack_488.elementSize.has_value_ = false;
      AStack_488.elementSize.contained = (storage_t<unsigned_int>)0x0;
      AStack_488.hidden.has_value_ = false;
      AStack_488.hidden.contained = (storage_t<bool>)0x0;
      AStack_488.comment.has_value_ = false;
      AStack_488.weight.contained = (storage_t<double>)0x0;
      AStack_488.connectability.has_value_ = false;
      AStack_488.bindMaterialAs.contained._16_8_ = 0;
      AStack_488.bindMaterialAs.contained._24_8_ = 0;
      AStack_488.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.bindMaterialAs.contained._8_8_ = 0;
      AStack_488.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &AStack_488.meta._M_t._M_impl.super__Rb_tree_header._M_header;
      AStack_488.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      AStack_488.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      AStack_488.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.comment.contained._8_8_ = 0;
      AStack_488.comment.contained._16_8_ = 0;
      AStack_488.comment.contained._24_8_ = 0;
      AStack_488.comment.contained._32_8_ = 0;
      AStack_488.comment.contained._40_8_ = 0;
      AStack_488.customData.has_value_ = false;
      AStack_488.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.customData.contained._8_8_ = 0;
      AStack_488.customData.contained._16_8_ = 0;
      AStack_488.customData.contained._24_8_ = 0;
      AStack_488.customData.contained._32_8_ = 0;
      AStack_488.customData.contained._40_8_ = 0;
      AStack_488.weight.has_value_ = false;
      AStack_488.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.connectability.contained._8_8_ = 0;
      AStack_488.connectability.contained._16_8_ = 0;
      AStack_488.connectability.contained._24_8_ = 0;
      AStack_488.outputName.has_value_ = false;
      AStack_488.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.outputName.contained._8_8_ = 0;
      AStack_488.outputName.contained._16_8_ = 0;
      AStack_488.outputName.contained._24_8_ = 0;
      AStack_488.renderType.has_value_ = false;
      AStack_488.sdrMetadata.has_value_ = false;
      AStack_488.renderType.contained._16_8_ = 0;
      AStack_488.renderType.contained._24_8_ = 0;
      AStack_488.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.renderType.contained._8_8_ = 0;
      AStack_488.displayName.has_value_ = false;
      AStack_488.sdrMetadata.contained._32_8_ = 0;
      AStack_488.sdrMetadata.contained._40_8_ = 0;
      AStack_488.sdrMetadata.contained._16_8_ = 0;
      AStack_488.sdrMetadata.contained._24_8_ = 0;
      AStack_488.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.sdrMetadata.contained._8_8_ = 0;
      AStack_488.displayGroup.has_value_ = false;
      AStack_488.displayName.contained._16_8_ = 0;
      AStack_488.displayName.contained._24_8_ = 0;
      AStack_488.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.displayName.contained._8_8_ = 0;
      AStack_488.bindMaterialAs.has_value_ = false;
      AStack_488.displayGroup.contained._16_8_ = 0;
      AStack_488.displayGroup.contained._24_8_ = 0;
      AStack_488.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      AStack_488.displayGroup.contained._8_8_ = 0;
      local_4a0[0x10] = 0;
      stack0xfffffffffffffb71 = 0;
      local_4a0._0_8_ = (pointer)0x0;
      local_4a0[8] = 0;
      local_4a0._9_7_ = 0;
      AStack_488.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      AStack_488.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      AStack_488.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      AStack_488.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      AStack_488.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           AStack_488.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4a0,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(tattr + 0x210));
      AttrMetas::operator=(&AStack_488,(AttrMetas *)tattr);
      local_280._8_8_ = &local_268;
      local_280[0] = (fmt)0x1;
      local_280._16_8_ = 0;
      local_268._M_local_buf[0] = '\0';
      local_258 = Varying;
      local_240 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_250.dynamic = (void *)0x0;
      local_238.interpolation.has_value_ = false;
      local_238.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
      local_238.elementSize.has_value_ = false;
      local_238.elementSize.contained = (storage_t<unsigned_int>)0x0;
      local_238.hidden.has_value_ = false;
      local_238.hidden.contained = (storage_t<bool>)0x0;
      local_238.comment.has_value_ = false;
      local_238.weight.contained = (storage_t<double>)0x0;
      local_238.connectability.has_value_ = false;
      local_238.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.bindMaterialAs.contained._8_8_ = 0;
      local_238.bindMaterialAs.contained._16_8_ = 0;
      local_238.bindMaterialAs.contained._24_8_ = 0;
      local_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_238.meta._M_t._M_impl.super__Rb_tree_header._M_header;
      local_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_238.customData.has_value_ = false;
      local_238.comment.contained._32_8_ = 0;
      local_238.comment.contained._40_8_ = 0;
      local_238.comment.contained._16_8_ = 0;
      local_238.comment.contained._24_8_ = 0;
      local_238.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.comment.contained._8_8_ = 0;
      local_238.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.customData.contained._8_8_ = 0;
      local_238.customData.contained._16_8_ = 0;
      local_238.customData.contained._24_8_ = 0;
      local_238.customData.contained._32_8_ = 0;
      local_238.customData.contained._40_8_ = 0;
      local_238.weight.has_value_ = false;
      local_238.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.connectability.contained._8_8_ = 0;
      local_238.connectability.contained._16_8_ = 0;
      local_238.connectability.contained._24_8_ = 0;
      local_238.outputName.has_value_ = false;
      local_238.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.outputName.contained._8_8_ = 0;
      local_238.outputName.contained._16_8_ = 0;
      local_238.outputName.contained._24_8_ = 0;
      local_238.renderType.has_value_ = false;
      local_238.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.renderType.contained._8_8_ = 0;
      local_238.renderType.contained._16_8_ = 0;
      local_238.renderType.contained._24_8_ = 0;
      local_238.sdrMetadata.has_value_ = false;
      local_238.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.sdrMetadata.contained._8_8_ = 0;
      local_238.sdrMetadata.contained._16_8_ = 0;
      local_238.sdrMetadata.contained._24_8_ = 0;
      local_238.sdrMetadata.contained._32_8_ = 0;
      local_238.sdrMetadata.contained._40_8_ = 0;
      local_238.displayName.has_value_ = false;
      local_238.displayGroup.has_value_ = false;
      local_238.displayName.contained._16_8_ = 0;
      local_238.displayName.contained._24_8_ = 0;
      local_238.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.displayName.contained._8_8_ = 0;
      local_238.bindMaterialAs.has_value_ = false;
      local_238.displayGroup.contained._16_8_ = 0;
      local_238.displayGroup.contained._24_8_ = 0;
      local_238.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
      local_238.displayGroup.contained._8_8_ = 0;
      local_238.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_238.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.stringData.
      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar5 = EvaluateAttribute(stage,(Attribute *)local_528,attr_name,
                                (TerminalAttributeValue *)local_280,err,t,tinterp);
      if (bVar5) {
        if ((local_280[0] == (fmt)0x0) &&
           (pcVar7 = tinyusdz::value::Value::as<tinyusdz::value::color4f>((Value *)&local_250,false)
           , pcVar7 != (color4f *)0x0)) {
          fVar1 = pcVar7->g;
          fVar2 = pcVar7->b;
          fVar3 = pcVar7->a;
          value_out->r = pcVar7->r;
          value_out->g = fVar1;
          value_out->b = fVar2;
          value_out->a = fVar3;
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (err != (string *)0x0) {
            local_588[0] = local_578;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_588,
                       "Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}"
                       ,"");
            TerminalAttributeValue::type_name_abi_cxx11_
                      (&local_548,(TerminalAttributeValue *)local_280);
            local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
            local_568.field_2._M_allocated_capacity._0_4_ = 0x6f6c6f63;
            local_568._M_string_length = 7;
            local_568.field_2._M_allocated_capacity._4_4_ = 0x663472;
            fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                      (&local_5a8,(fmt *)local_588,&local_548,&local_568,attr_name,args_2);
            ::std::__cxx11::string::_M_append((char *)err,(ulong)local_5a8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
              operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p,
                              CONCAT44(local_568.field_2._M_allocated_capacity._4_4_,
                                       local_568.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_548._M_dataplus._M_p != &local_548.field_2) {
              operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_588[0] != local_578) {
              operator_delete(local_588[0],local_578[0] + 1);
            }
          }
        }
      }
      AttrMetas::~AttrMetas(&local_238);
      if (local_240 != (vtable_type *)0x0) {
        (*local_240->destroy)(&local_250);
        local_240 = (vtable_type *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._8_8_ != &local_268) {
        operator_delete((void *)local_280._8_8_,
                        CONCAT71(local_268._M_allocated_capacity._1_7_,local_268._M_local_buf[0]) +
                        1);
      }
      AttrMetas::~AttrMetas(&AStack_488);
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4a0);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_4c0);
      if (local_4d0 != (vtable_type *)0x0) {
        (*local_4d0->destroy)(&local_4e0);
        local_4d0 = (vtable_type *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(uStack_4ff,uStack_500) != &local_4f0) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(uStack_4ff,uStack_500),
                        CONCAT71(local_4f0._M_allocated_capacity._1_7_,local_4f0._M_local_buf[0]) +
                        1);
      }
      if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
        operator_delete((void *)local_528._0_8_,
                        CONCAT62(local_528._18_6_,CONCAT11(local_528[0x11],local_528[0x10])) + 1);
      }
      if (bVar4) {
        return false;
      }
      return bVar5;
    }
    if (tattr[0x208] != (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::color4f>_>)0x1) {
      if (err == (string *)0x0) {
        return false;
      }
      local_280._0_8_ = local_280 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_280,"[Internal error] Invalid TypedAttribute? : {} \n","");
      fmt::format<std::__cxx11::string>
                ((string *)local_528,(fmt *)local_280,(string *)attr_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_out);
      ::std::__cxx11::string::_M_append((char *)err,local_528._0_8_);
      if ((undefined1 *)local_528._0_8_ != local_528 + 0x10) {
        operator_delete((void *)local_528._0_8_,
                        CONCAT62(local_528._18_6_,CONCAT11(local_528[0x11],local_528[0x10])) + 1);
      }
      if ((undefined1 *)local_280._0_8_ == local_280 + 0x10) {
        return false;
      }
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      return false;
    }
  }
  if (err != (string *)0x0) {
    ::std::__cxx11::string::append((char *)err);
  }
  return false;
}

Assistant:

bool EvaluateTypedAnimatableAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<Animatable<T>> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err,
    const double t,
    const value::TimeSampleInterpolationType tinterp) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  // Eval order:
  // - ValueBlocked?
  // - has value?(default value or timesamped value)
  // - has connection?

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.has_value()) {
    Animatable<T> value;
    if (tattr.get_value(&value)) {
      if (value.get(t, value_out, tinterp)) {
        return true;
      } else {
        if (err) {
          (*err) += fmt::format("Failed to get TypedAnimatableAttribute value: {} \n", attr_name);
        }
        return false;
      }
    }
  } else if (tattr.has_connections()) {

    // Follow targetPath
    Attribute attr = ToAttributeConnection(tattr);

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 t, tinterp);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}[]. Attribute: {}", value.type_name(), value::TypeTraits<T>::type_name(), attr_name);
    }

  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else {
    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}